

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O2

void __thiscall
cfd::core::JsonObjectVector<cfd::api::json::PsbtSignatureData,_PsbtSignatureDataStruct>::
ConvertFromStruct(JsonObjectVector<cfd::api::json::PsbtSignatureData,_PsbtSignatureDataStruct> *this
                 ,vector<PsbtSignatureDataStruct,_std::allocator<PsbtSignatureDataStruct>_> *list)

{
  pointer pPVar1;
  pointer data;
  PsbtSignatureData object;
  PsbtSignatureData PStack_98;
  
  pPVar1 = (list->
           super__Vector_base<PsbtSignatureDataStruct,_std::allocator<PsbtSignatureDataStruct>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (data = (list->
              super__Vector_base<PsbtSignatureDataStruct,_std::allocator<PsbtSignatureDataStruct>_>)
              ._M_impl.super__Vector_impl_data._M_start; data != pPVar1; data = data + 1) {
    cfd::api::json::PsbtSignatureData::PsbtSignatureData(&PStack_98);
    cfd::api::json::PsbtSignatureData::ConvertFromStruct(&PStack_98,data);
    ::std::
    vector<cfd::api::json::PsbtSignatureData,_std::allocator<cfd::api::json::PsbtSignatureData>_>::
    push_back(&(this->super_JsonVector<cfd::api::json::PsbtSignatureData>).
               super_vector<cfd::api::json::PsbtSignatureData,_std::allocator<cfd::api::json::PsbtSignatureData>_>
              ,&PStack_98);
    cfd::api::json::PsbtSignatureData::~PsbtSignatureData(&PStack_98);
  }
  return;
}

Assistant:

void ConvertFromStruct(const std::vector<STRUCT_TYPE>& list) {
    for (const auto& element : list) {
      TYPE object;
      object.ConvertFromStruct(element);
      std::vector<TYPE>::push_back(object);
    }
  }